

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

void SendAbort(void)

{
  long lVar1;
  int iVar2;
  BYTE dis [2];
  
  if (1 < doomcom.numnodes) {
    if (consoleplayer == 0) {
      for (lVar1 = 1; lVar1 < doomcom.numnodes; lVar1 = lVar1 + 1) {
        for (iVar2 = -4; iVar2 != 0; iVar2 = iVar2 + 1) {
          PreSend(dis,2,sendaddress + lVar1);
        }
      }
    }
    else {
      for (iVar2 = -4; iVar2 != 0; iVar2 = iVar2 + 1) {
        PreSend(dis,2,sendaddress + 1);
      }
    }
  }
  return;
}

Assistant:

void SendAbort (void)
{
	BYTE dis[2] = { PRE_FAKE, PRE_DISCONNECT };
	int i, j;

	if (doomcom.numnodes > 1)
	{
		if (consoleplayer == 0)
		{
			// The host needs to let everyone know
			for (i = 1; i < doomcom.numnodes; ++i)
			{
				for (j = 4; j > 0; --j)
				{
					PreSend (dis, 2, &sendaddress[i]);
				}
			}
		}
		else
		{
			// Guests only need to let the host know.
			for (i = 4; i > 0; --i)
			{
				PreSend (dis, 2, &sendaddress[1]);
			}
		}
	}
}